

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O1

bool check_entwine(CHAR_DATA *ch,int type)

{
  AFFECT_DATA *pAVar1;
  bool bVar2;
  
  pAVar1 = ch->affected;
  do {
    bVar2 = pAVar1 != (AFFECT_DATA *)0x0;
    if (!bVar2) {
      return bVar2;
    }
    if (type == 2) {
      if ((pAVar1->type == gsn_entwine) && (pAVar1->location == 2)) {
        return bVar2;
      }
    }
    else if (type == 1) {
      if ((pAVar1->type == gsn_entwine) && (pAVar1->modifier == 1)) {
        return bVar2;
      }
    }
    else if (((type == 0) && (pAVar1->type == gsn_entwine)) && (pAVar1->modifier == 0)) {
      return bVar2;
    }
    pAVar1 = pAVar1->next;
  } while( true );
}

Assistant:

bool check_entwine(CHAR_DATA *ch, int type)
{
	for (AFFECT_DATA *af = ch->affected; af != nullptr; af = af->next)
	{
		if (type == 0 && af->type == gsn_entwine && af->modifier == 0)
			return true;
		else if (type == 1 && af->type == gsn_entwine && af->modifier == 1)
			return true;
		else if (type == 2 && af->type == gsn_entwine && af->location == APPLY_DEX)
			return true;
	}

	return false;
}